

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

string * __thiscall
cmNinjaTargetGenerator::GetTargetFilePath
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,string *name)

{
  pointer pcVar1;
  int iVar2;
  string path;
  _Alloc_hider local_38;
  size_type local_30;
  char local_28;
  undefined7 uStack_27;
  undefined8 uStack_20;
  
  (*(this->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[4])(&local_38);
  if (local_30 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)&local_38);
    if (iVar2 != 0) {
      std::__cxx11::string::append((char *)&local_38);
      std::__cxx11::string::_M_append((char *)&local_38,(ulong)(name->_M_dataplus)._M_p);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      if (local_38._M_p == &local_28) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_27,local_28);
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_20;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_38._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_27,local_28);
      }
      __return_storage_ptr__->_M_string_length = local_30;
      local_30 = 0;
      local_28 = '\0';
      local_38._M_p = &local_28;
      goto LAB_0023f672;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + name->_M_string_length);
LAB_0023f672:
  if (local_38._M_p != &local_28) {
    operator_delete(local_38._M_p,CONCAT71(uStack_27,local_28) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::GetTargetFilePath(
  const std::string& name) const
{
  std::string path = this->GetTargetOutputDir();
  if (path.empty() || path == ".") {
    return name;
  }
  path += "/";
  path += name;
  return path;
}